

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::readHeadOfDataObject(XFileParser *this,string *poName)

{
  Scene *this_00;
  bool bVar1;
  allocator<char> local_89;
  string local_88;
  string local_68;
  undefined1 local_38 [8];
  string nameOrBrace;
  string *poName_local;
  XFileParser *this_local;
  
  nameOrBrace.field_2._8_8_ = poName;
  GetNextToken_abi_cxx11_((string *)local_38,this);
  bVar1 = std::operator!=((string *)local_38,"{");
  if (bVar1) {
    if (nameOrBrace.field_2._8_8_ != 0) {
      std::__cxx11::string::operator=((string *)nameOrBrace.field_2._8_8_,(string *)local_38);
    }
    GetNextToken_abi_cxx11_(&local_68,this);
    bVar1 = std::operator!=(&local_68,"{");
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar1) {
      this_00 = this->mScene;
      if (this_00 != (Scene *)0x0) {
        XFile::Scene::~Scene(this_00);
        operator_delete(this_00,0x58);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"Opening brace expected.",&local_89);
      ThrowException(this,&local_88);
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void XFileParser::readHeadOfDataObject( std::string* poName)
{
    std::string nameOrBrace = GetNextToken();
    if( nameOrBrace != "{")
    {
        if( poName)
            *poName = nameOrBrace;

        if ( GetNextToken() != "{" ) {
            delete mScene;
            ThrowException( "Opening brace expected." );
        }
    }
}